

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetCommand.cxx
# Opt level: O2

bool cmSetCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *args,cmExecutionStatus *status)

{
  long lVar1;
  string *var;
  bool bVar2;
  bool force;
  bool bVar3;
  CacheEntryType CVar4;
  ulong uVar5;
  cmState *this;
  cmValue cVar6;
  pointer pbVar7;
  uint uVar8;
  pointer pbVar9;
  uint uVar10;
  pointer doc;
  string_view separator;
  string_view value_00;
  string_view str;
  string putEnvArg;
  string value;
  string currValue;
  CacheEntryType type;
  long local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  var = (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if (var == (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value,"called with incorrect number of arguments",
               (allocator<char> *)&putEnvArg);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&value);
    return false;
  }
  str._M_str = (var->_M_dataplus)._M_p;
  str._M_len = var->_M_string_length;
  bVar2 = cmHasLiteralPrefix<5ul>(str,(char (*) [5])"ENV{");
  if ((bVar2) && (5 < var->_M_string_length)) {
    std::__cxx11::string::substr((ulong)&value,(ulong)var);
    std::operator+(&putEnvArg,&value,"=");
    currValue._M_dataplus._M_p = (pointer)&currValue.field_2;
    currValue._M_string_length = 0;
    currValue.field_2._M_local_buf[0] = '\0';
    bVar2 = cmsys::SystemTools::GetEnv(&value,&currValue);
    pbVar7 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (((ulong)((long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7) < 0x21) ||
       (pbVar7[1]._M_string_length == 0)) {
      if (bVar2) {
        cmsys::SystemTools::PutEnv(&putEnvArg);
      }
    }
    else {
      if ((!bVar2) || (bVar2 = std::operator!=(&currValue,pbVar7 + 1), bVar2)) {
        std::__cxx11::string::append((string *)&putEnvArg);
        cmsys::SystemTools::PutEnv(&putEnvArg);
      }
      pbVar7 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (0x40 < (ulong)((long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7)) {
        std::operator+(&local_50,
                       "Only the first value argument is used when setting an environment variable.  Argument \'"
                       ,pbVar7 + 2);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                       &local_50,"\' and later are unused.");
        std::__cxx11::string::~string((string *)&local_50);
        cmMakefile::IssueMessage(status->Makefile,AUTHOR_WARNING,(string *)&type);
        std::__cxx11::string::~string((string *)&type);
      }
    }
    std::__cxx11::string::~string((string *)&currValue);
    std::__cxx11::string::~string((string *)&putEnvArg);
    std::__cxx11::string::~string((string *)&value);
    return true;
  }
  pbVar7 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)pbVar9 - (long)pbVar7;
  if ((long)uVar5 >> 5 == 2) {
    bVar2 = std::operator==(pbVar9 + -1,"PARENT_SCOPE");
    if (bVar2) {
      cmMakefile::RaiseScope(status->Makefile,var,(char *)0x0);
      return true;
    }
    pbVar7 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar9 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    uVar5 = (long)pbVar9 - (long)pbVar7;
  }
  else if ((long)uVar5 >> 5 == 1) {
    cmMakefile::RemoveDefinition(status->Makefile,var);
    return true;
  }
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  type = STRING;
  if (uVar5 < 0x21) {
LAB_00320b3a:
    force = false;
    uVar10 = 0;
LAB_00320b3d:
    if ((ulong)((long)uVar5 >> 5) < 4) {
      bVar3 = false;
      bVar2 = false;
    }
    else {
      bVar3 = std::operator==(pbVar7 + (((long)uVar5 >> 5) - (ulong)force) + -3,"CACHE");
      uVar8 = uVar10 + 3;
      if (!bVar3) {
        uVar8 = uVar10;
      }
      pbVar7 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar9 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      bVar2 = false;
      uVar10 = uVar8;
    }
  }
  else {
    bVar2 = std::operator==(pbVar9 + -1,"PARENT_SCOPE");
    pbVar7 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar9 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    force = false;
    if (!bVar2) {
      uVar5 = (long)pbVar9 - (long)pbVar7;
      if (uVar5 < 0x81) goto LAB_00320b3a;
      force = std::operator==(pbVar9 + -1,"FORCE");
      uVar10 = (uint)force;
      pbVar7 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar9 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      uVar5 = (long)pbVar9 - (long)pbVar7;
      goto LAB_00320b3d;
    }
    bVar2 = true;
    bVar3 = false;
    uVar10 = 1;
  }
  currValue._M_dataplus._M_p = (pointer)(pbVar7 + 1);
  currValue._M_string_length = (long)pbVar9 - (ulong)(uVar10 << 5);
  separator._M_str = ";";
  separator._M_len = 1;
  cmJoin(&putEnvArg,(cmStringRange *)&currValue,separator,(string_view)ZEXT816(0));
  std::__cxx11::string::operator=((string *)&value,(string *)&putEnvArg);
  std::__cxx11::string::~string((string *)&putEnvArg);
  if (bVar2) {
    bVar2 = true;
    cmMakefile::RaiseScope(status->Makefile,var,value._M_dataplus._M_p);
  }
  else {
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish + -1,"CACHE");
    if (!bVar2) {
      pbVar7 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar5 = (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7;
      if (((uVar5 < 0x21) ||
          (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)pbVar7 + (uVar5 - 0x40)),"CACHE"), !bVar2)) &&
         (force != true || bVar3 != false)) {
        if (bVar3 == false) {
          doc = (char *)0x0;
        }
        else {
          pbVar7 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_58 = ((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5) -
                     (ulong)force;
          lVar1 = local_58 + -2;
          bVar2 = cmState::StringToCacheEntryType(pbVar7 + lVar1,&type);
          if (!bVar2) {
            std::operator+(&currValue,"implicitly converting \'",
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + lVar1);
            std::operator+(&putEnvArg,&currValue,"\' to \'STRING\' type.");
            std::__cxx11::string::~string((string *)&currValue);
            cmMakefile::IssueMessage(status->Makefile,AUTHOR_WARNING,&putEnvArg);
            type = STRING;
            std::__cxx11::string::~string((string *)&putEnvArg);
          }
          doc = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[local_58 + -1]._M_dataplus._M_p;
        }
        this = cmMakefile::GetState(status->Makefile);
        cVar6 = cmState::GetCacheEntryValue(this,var);
        if (((cVar6.Value == (string *)0x0) ||
            (CVar4 = cmState::GetCacheEntryType(this,var), CVar4 == UNINITIALIZED)) ||
           ((bVar3 == false || ((type == INTERNAL || (bVar2 = true, force != false)))))) {
          if (bVar3 == false) {
            bVar2 = true;
            value_00._M_str = value._M_dataplus._M_p;
            value_00._M_len = value._M_string_length;
            cmMakefile::AddDefinition(status->Makefile,var,value_00);
          }
          else {
            bVar2 = true;
            cmMakefile::AddCacheDefinition
                      (status->Makefile,var,value._M_dataplus._M_p,doc,type,force);
          }
        }
        goto LAB_00320d2f;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&putEnvArg,"given invalid arguments for CACHE mode.",
               (allocator<char> *)&currValue);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&putEnvArg);
    bVar2 = false;
  }
LAB_00320d2f:
  std::__cxx11::string::~string((string *)&value);
  return bVar2;
}

Assistant:

bool cmSetCommand(std::vector<std::string> const& args,
                  cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // watch for ENV signatures
  auto const& variable = args[0]; // VAR is always first
  if (cmHasLiteralPrefix(variable, "ENV{") && variable.size() > 5) {
    // what is the variable name
    auto const& varName = variable.substr(4, variable.size() - 5);
    std::string putEnvArg = varName + "=";

    // what is the current value if any
    std::string currValue;
    const bool currValueSet = cmSystemTools::GetEnv(varName, currValue);

    // will it be set to something, then set it
    if (args.size() > 1 && !args[1].empty()) {
      // but only if it is different from current value
      if (!currValueSet || currValue != args[1]) {
        putEnvArg += args[1];
        cmSystemTools::PutEnv(putEnvArg);
      }
      // if there's extra arguments, warn user
      // that they are ignored by this command.
      if (args.size() > 2) {
        std::string m = "Only the first value argument is used when setting "
                        "an environment variable.  Argument '" +
          args[2] + "' and later are unused.";
        status.GetMakefile().IssueMessage(MessageType::AUTHOR_WARNING, m);
      }
      return true;
    }

    // if it will be cleared, then clear it if it isn't already clear
    if (currValueSet) {
      cmSystemTools::PutEnv(putEnvArg);
    }
    return true;
  }

  // SET (VAR) // Removes the definition of VAR.
  if (args.size() == 1) {
    status.GetMakefile().RemoveDefinition(variable);
    return true;
  }
  // SET (VAR PARENT_SCOPE) // Removes the definition of VAR
  // in the parent scope.
  if (args.size() == 2 && args.back() == "PARENT_SCOPE") {
    status.GetMakefile().RaiseScope(variable, nullptr);
    return true;
  }

  // here are the remaining options
  //  SET (VAR value )
  //  SET (VAR value PARENT_SCOPE)
  //  SET (VAR CACHE TYPE "doc String" [FORCE])
  //  SET (VAR value CACHE TYPE "doc string" [FORCE])
  std::string value;  // optional
  bool cache = false; // optional
  bool force = false; // optional
  bool parentScope = false;
  cmStateEnums::CacheEntryType type =
    cmStateEnums::STRING;          // required if cache
  const char* docstring = nullptr; // required if cache

  unsigned int ignoreLastArgs = 0;
  // look for PARENT_SCOPE argument
  if (args.size() > 1 && args.back() == "PARENT_SCOPE") {
    parentScope = true;
    ignoreLastArgs++;
  } else {
    // look for FORCE argument
    if (args.size() > 4 && args.back() == "FORCE") {
      force = true;
      ignoreLastArgs++;
    }

    // check for cache signature
    if (args.size() > 3 &&
        args[args.size() - 3 - (force ? 1 : 0)] == "CACHE") {
      cache = true;
      ignoreLastArgs += 3;
    }
  }

  // collect any values into a single semi-colon separated value list
  value = cmJoin(cmMakeRange(args).advance(1).retreat(ignoreLastArgs), ";");

  if (parentScope) {
    status.GetMakefile().RaiseScope(variable, value.c_str());
    return true;
  }

  // we should be nice and try to catch some simple screwups if the last or
  // next to last args are CACHE then they screwed up.  If they used FORCE
  // without CACHE they screwed up
  if ((args.back() == "CACHE") ||
      (args.size() > 1 && args[args.size() - 2] == "CACHE") ||
      (force && !cache)) {
    status.SetError("given invalid arguments for CACHE mode.");
    return false;
  }

  if (cache) {
    std::string::size_type cacheStart = args.size() - 3 - (force ? 1 : 0);
    if (!cmState::StringToCacheEntryType(args[cacheStart + 1], type)) {
      std::string m = "implicitly converting '" + args[cacheStart + 1] +
        "' to 'STRING' type.";
      status.GetMakefile().IssueMessage(MessageType::AUTHOR_WARNING, m);
      // Setting this may not be required, since it's
      // initialized as a string. Keeping this here to
      // ensure that the type is actually converting to a string.
      type = cmStateEnums::STRING;
    }
    docstring = args[cacheStart + 2].c_str();
  }

  // see if this is already in the cache
  cmState* state = status.GetMakefile().GetState();
  cmValue existingValue = state->GetCacheEntryValue(variable);
  if (existingValue &&
      (state->GetCacheEntryType(variable) != cmStateEnums::UNINITIALIZED)) {
    // if the set is trying to CACHE the value but the value
    // is already in the cache and the type is not internal
    // then leave now without setting any definitions in the cache
    // or the makefile
    if (cache && type != cmStateEnums::INTERNAL && !force) {
      return true;
    }
  }

  // if it is meant to be in the cache then define it in the cache
  if (cache) {
    status.GetMakefile().AddCacheDefinition(variable, value, docstring, type,
                                            force);
  } else {
    // add the definition
    status.GetMakefile().AddDefinition(variable, value);
  }
  return true;
}